

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

size_type __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::getUserSize
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  long lVar4;
  
  if ((ptr != (void *)0x0) && (uVar1 = *(ulong *)((long)ptr + -8), (uVar1 & 1) != 0)) {
    uVar2 = uVar1 & 0xfffffffffffffff0;
    if ((uVar1 & 2) != 0) {
      lVar4 = (long)*(char *)((long)ptr + (uVar2 - 0x11));
      if (lVar4 < 1) {
        puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
        *puVar3 = 3;
        *(char **)(puVar3 + 2) = "Invalid padding byte value";
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar2 = uVar2 - lVar4;
    }
    return uVar2 - 0x10;
  }
  return 0;
}

Assistant:

size_type
    getUserSize (T* ptr)
    {
        if (ptr == nullptr)
        {
            return 0;
        }
        MemChunk* chunk = mem2Chunk (ptr);
        if (chunk->isUsed ())
        {
            return chunk->getUserSize ();
        }
        return 0;
    }